

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O1

A * hiberlite::Database::dbLoad<A>(bean_key *key)

{
  int *piVar1;
  A *pAVar2;
  BeanLoader bl;
  bean_key local_138;
  BeanLoader local_120;
  
  BeanLoader::BeanLoader(&local_120);
  local_138.id = key->id;
  local_138.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d4578;
  local_138.con.res = (key->con).res;
  if (local_138.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_138.con.res)->refCount = (local_138.con.res)->refCount + 1;
  }
  pAVar2 = BeanLoader::loadBean<A>(&local_120,&local_138);
  local_138.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d4578;
  if (local_138.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &(local_138.con.res)->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_138.con.res)->_vptr_shared_cnt_obj_pair[1])();
    }
  }
  std::
  deque<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
  ::~deque((deque<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
            *)&local_120.actor);
  AVisitor<hiberlite::LoadBean>::~AVisitor(&local_120.super_AVisitor<hiberlite::LoadBean>);
  return pAVar2;
}

Assistant:

C* Database::dbLoad(bean_key key)
{
	BeanLoader bl;
	return bl.loadBean<C>(key);
}